

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::sse2::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  byte bVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  ulong uVar24;
  RTCFilterFunctionN p_Var25;
  RTCRayN *pRVar26;
  long lVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  float fVar33;
  uint uVar34;
  float fVar44;
  float fVar46;
  float fVar48;
  undefined1 auVar35 [16];
  uint uVar45;
  uint uVar47;
  uint uVar49;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar43;
  uint uVar50;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  float fVar90;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar86;
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vbool<4> valid;
  undefined1 local_238 [16];
  undefined1 (*local_220) [16];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  uint local_d8 [4];
  HitK<4> h;
  
  pSVar9 = context->scene;
  local_d8[0] = sphere->sharedGeomID;
  pGVar10 = (pSVar9->geometries).items[local_d8[0]].ptr;
  lVar27 = *(long *)&pGVar10->field_0x58;
  _Var11 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar27 + (sphere->primIDs).field_0.i[0] * _Var11);
  pfVar2 = (float *)(lVar27 + (sphere->primIDs).field_0.i[1] * _Var11);
  pfVar3 = (float *)(lVar27 + (sphere->primIDs).field_0.i[2] * _Var11);
  pfVar4 = (float *)(lVar27 + (sphere->primIDs).field_0.i[3] * _Var11);
  bVar8 = sphere->numPrimitives;
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar33 = *(float *)(ray + k * 4);
  fVar44 = *(float *)(ray + k * 4 + 0x10);
  fVar46 = *(float *)(ray + k * 4 + 0x20);
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  fVar6 = *(float *)(ray + k * 4 + 0x50);
  fVar7 = *(float *)(ray + k * 4 + 0x60);
  auVar92._0_4_ = fVar5 * fVar5 + fVar6 * fVar6 + fVar7 * fVar7;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar85 = rcpps(ZEXT416((uint)(fVar7 * fVar7)),auVar92);
  fVar68 = auVar85._0_4_;
  fVar78 = auVar85._4_4_;
  fVar79 = auVar85._8_4_;
  fVar80 = auVar85._12_4_;
  fVar68 = (1.0 - auVar92._0_4_ * fVar68) * fVar68 + fVar68;
  fVar78 = (1.0 - auVar92._0_4_ * fVar78) * fVar78 + fVar78;
  fVar79 = (1.0 - auVar92._0_4_ * fVar79) * fVar79 + fVar79;
  fVar80 = (1.0 - auVar92._0_4_ * fVar80) * fVar80 + fVar80;
  fVar96 = ((*pfVar1 - fVar33) * fVar5 + (pfVar1[1] - fVar44) * fVar6 + (pfVar1[2] - fVar46) * fVar7
           ) * fVar68;
  fVar97 = ((*pfVar2 - fVar33) * fVar5 + (pfVar2[1] - fVar44) * fVar6 + (pfVar2[2] - fVar46) * fVar7
           ) * fVar78;
  fVar98 = ((*pfVar3 - fVar33) * fVar5 + (pfVar3[1] - fVar44) * fVar6 + (pfVar3[2] - fVar46) * fVar7
           ) * fVar79;
  fVar99 = ((*pfVar4 - fVar33) * fVar5 + (pfVar4[1] - fVar44) * fVar6 + (pfVar4[2] - fVar46) * fVar7
           ) * fVar80;
  fVar105 = (*pfVar1 - fVar33) - fVar5 * fVar96;
  fVar106 = (*pfVar2 - fVar33) - fVar5 * fVar97;
  fVar107 = (*pfVar3 - fVar33) - fVar5 * fVar98;
  fVar108 = (*pfVar4 - fVar33) - fVar5 * fVar99;
  fVar101 = (pfVar1[1] - fVar44) - fVar6 * fVar96;
  fVar102 = (pfVar2[1] - fVar44) - fVar6 * fVar97;
  fVar103 = (pfVar3[1] - fVar44) - fVar6 * fVar98;
  fVar104 = (pfVar4[1] - fVar44) - fVar6 * fVar99;
  fVar109 = (pfVar1[2] - fVar46) - fVar7 * fVar96;
  fVar110 = (pfVar2[2] - fVar46) - fVar7 * fVar97;
  fVar111 = (pfVar3[2] - fVar46) - fVar7 * fVar98;
  fVar112 = (pfVar4[2] - fVar46) - fVar7 * fVar99;
  auVar91._0_4_ = fVar101 * fVar101 + fVar109 * fVar109;
  auVar91._4_4_ = fVar102 * fVar102 + fVar110 * fVar110;
  auVar91._8_4_ = fVar103 * fVar103 + fVar111 * fVar111;
  auVar91._12_4_ = fVar104 * fVar104 + fVar112 * fVar112;
  fVar84 = fVar105 * fVar105 + auVar91._0_4_;
  fVar88 = fVar106 * fVar106 + auVar91._4_4_;
  fVar89 = fVar107 * fVar107 + auVar91._8_4_;
  fVar90 = fVar108 * fVar108 + auVar91._12_4_;
  fVar33 = pfVar1[3] * pfVar1[3];
  fVar44 = pfVar2[3] * pfVar2[3];
  fVar46 = pfVar3[3] * pfVar3[3];
  fVar48 = pfVar4[3] * pfVar4[3];
  bVar17 = bVar8 != 0 && fVar84 <= fVar33;
  auVar85._0_4_ = -(uint)bVar17;
  bVar18 = 1 < bVar8 && fVar88 <= fVar44;
  auVar85._4_4_ = -(uint)bVar18;
  bVar15 = 2 < bVar8 && fVar89 <= fVar46;
  auVar85._8_4_ = -(uint)bVar15;
  bVar13 = 3 < bVar8 && fVar90 <= fVar48;
  auVar85._12_4_ = -(uint)bVar13;
  iVar21 = movmskps(local_d8[0],auVar85);
  if (iVar21 != 0) {
    auVar69._0_4_ = fVar68 * (fVar33 - fVar84);
    auVar69._4_4_ = fVar78 * (fVar44 - fVar88);
    auVar69._8_4_ = fVar79 * (fVar46 - fVar89);
    auVar69._12_4_ = fVar80 * (fVar48 - fVar90);
    auVar92 = sqrtps(auVar91,auVar69);
    fVar46 = auVar92._0_4_;
    fVar79 = fVar96 - fVar46;
    fVar48 = auVar92._4_4_;
    fVar80 = fVar97 - fVar48;
    fVar68 = auVar92._8_4_;
    fVar84 = fVar98 - fVar68;
    fVar78 = auVar92._12_4_;
    fVar88 = fVar99 - fVar78;
    fVar96 = fVar96 + fVar46;
    fVar97 = fVar97 + fVar48;
    fVar98 = fVar98 + fVar68;
    fVar99 = fVar99 + fVar78;
    fVar33 = *(float *)(ray + k * 4 + 0x30);
    fVar44 = *(float *)(ray + k * 4 + 0x80);
    bVar19 = fVar33 <= fVar79 && fVar79 <= fVar44;
    bVar20 = fVar33 <= fVar80 && fVar80 <= fVar44;
    bVar16 = fVar33 <= fVar84 && fVar84 <= fVar44;
    bVar14 = fVar33 <= fVar88 && fVar88 <= fVar44;
    uVar50 = -(uint)(bVar19 && bVar17);
    uVar65 = -(uint)(bVar20 && bVar18);
    auVar35._4_4_ = uVar65;
    auVar35._0_4_ = uVar50;
    uVar66 = -(uint)(bVar16 && bVar15);
    uVar67 = -(uint)(bVar14 && bVar13);
    bVar17 = (fVar33 <= fVar96 && fVar96 <= fVar44) && bVar17;
    auVar94._0_4_ = -(uint)bVar17;
    bVar18 = (fVar33 <= fVar97 && fVar97 <= fVar44) && bVar18;
    auVar94._4_4_ = -(uint)bVar18;
    bVar15 = (fVar33 <= fVar98 && fVar98 <= fVar44) && bVar15;
    auVar94._8_4_ = -(uint)bVar15;
    bVar13 = (fVar33 <= fVar99 && fVar99 <= fVar44) && bVar13;
    auVar94._12_4_ = -(uint)bVar13;
    auVar35._8_4_ = uVar66;
    auVar35._12_4_ = uVar67;
    valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar35 | auVar94);
    iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
    if (iVar21 != 0) {
      fVar89 = (float)((uint)fVar79 & uVar50 | ~uVar50 & (uint)fVar96);
      fVar90 = (float)((uint)fVar80 & uVar65 | ~uVar65 & (uint)fVar97);
      fVar100 = (float)((uint)fVar84 & uVar66 | ~uVar66 & (uint)fVar98);
      fVar88 = (float)((uint)fVar88 & uVar67 | ~uVar67 & (uint)fVar99);
      fVar33 = (float)(~uVar50 & (uint)fVar46 | (uint)-fVar46 & uVar50);
      fVar79 = (float)(~uVar65 & (uint)fVar48 | (uint)-fVar48 & uVar65);
      fVar80 = (float)(~uVar66 & (uint)fVar68 | (uint)-fVar68 & uVar66);
      fVar84 = (float)(~uVar67 & (uint)fVar78 | (uint)-fVar78 & uVar67);
      hit.vt.field_0.v[0] = fVar89;
      hit.vt.field_0.v[1] = fVar90;
      hit.vt.field_0.v[2] = fVar100;
      hit.vt.field_0.v[3] = fVar88;
      hit.vNg.field_0._0_4_ = fVar5 * fVar33 - fVar105;
      hit.vNg.field_0._4_4_ = fVar5 * fVar79 - fVar106;
      hit.vNg.field_0._8_4_ = fVar5 * fVar80 - fVar107;
      hit.vNg.field_0._12_4_ = fVar5 * fVar84 - fVar108;
      hit.vNg.field_0._16_4_ = fVar6 * fVar33 - fVar101;
      hit.vNg.field_0._20_4_ = fVar6 * fVar79 - fVar102;
      hit.vNg.field_0._24_4_ = fVar6 * fVar80 - fVar103;
      hit.vNg.field_0._28_4_ = fVar6 * fVar84 - fVar104;
      hit.vNg.field_0._32_4_ = fVar33 * fVar7 - fVar109;
      hit.vNg.field_0._36_4_ = fVar79 * fVar7 - fVar110;
      hit.vNg.field_0._40_4_ = fVar80 * fVar7 - fVar111;
      hit.vNg.field_0._44_4_ = fVar84 * fVar7 - fVar112;
      uVar34 = valid.field_0._0_4_;
      auVar51._0_4_ = (uint)fVar89 & uVar34;
      uVar45 = valid.field_0._4_4_;
      auVar51._4_4_ = (uint)fVar90 & uVar45;
      uVar47 = valid.field_0._8_4_;
      auVar51._8_4_ = (uint)fVar100 & uVar47;
      uVar49 = valid.field_0._12_4_;
      auVar51._12_4_ = (uint)fVar88 & uVar49;
      auVar70._0_8_ = CONCAT44(~uVar45,~uVar34) & 0x7f8000007f800000;
      auVar70._8_4_ = ~uVar47 & 0x7f800000;
      auVar70._12_4_ = ~uVar49 & 0x7f800000;
      auVar70 = auVar70 | auVar51;
      auVar81._4_4_ = auVar70._0_4_;
      auVar81._0_4_ = auVar70._4_4_;
      auVar81._8_4_ = auVar70._12_4_;
      auVar81._12_4_ = auVar70._8_4_;
      auVar92 = minps(auVar81,auVar70);
      auVar52._0_8_ = auVar92._8_8_;
      auVar52._8_4_ = auVar92._0_4_;
      auVar52._12_4_ = auVar92._4_4_;
      auVar92 = minps(auVar52,auVar92);
      uVar29 = -(uint)(auVar92._0_4_ == auVar70._0_4_);
      uVar30 = -(uint)(auVar92._4_4_ == auVar70._4_4_);
      uVar31 = -(uint)(auVar92._8_4_ == auVar70._8_4_);
      uVar32 = -(uint)(auVar92._12_4_ == auVar70._12_4_);
      auVar71._0_4_ = uVar29 & uVar34;
      auVar71._4_4_ = uVar30 & uVar45;
      auVar71._8_4_ = uVar31 & uVar47;
      auVar71._12_4_ = uVar32 & uVar49;
      iVar21 = movmskps(iVar21,auVar71);
      uVar50 = 0xffffffff;
      uVar65 = 0xffffffff;
      uVar66 = 0xffffffff;
      uVar67 = 0xffffffff;
      if (iVar21 != 0) {
        uVar50 = uVar29;
        uVar65 = uVar30;
        uVar66 = uVar31;
        uVar67 = uVar32;
      }
      auVar36._0_4_ = uVar34 & uVar50;
      auVar36._4_4_ = uVar45 & uVar65;
      auVar36._8_4_ = uVar47 & uVar66;
      auVar36._12_4_ = uVar49 & uVar67;
      uVar50 = movmskps(iVar21,auVar36);
      lVar27 = 0;
      if (uVar50 != 0) {
        for (; (uVar50 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
        }
      }
      pauVar28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      do {
        args.hit = (RTCHitN *)&h;
        args.valid = (int *)local_238;
        h.geomID.field_0.i[0] = local_d8[lVar27];
        uVar24 = (ulong)h.geomID.field_0.i[0];
        pGVar10 = (pSVar9->geometries).items[uVar24].ptr;
        args.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_238 + lVar27 * 4 + -0x10) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar44 = hit.vt.field_0.v[lVar27];
            *(float *)(ray + k * 4 + 0x80) = fVar44;
            *(undefined4 *)(ray + k * 4 + 0xc0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0xe0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x20);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar27];
            *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar50 = context->user->instPrimID[0];
            uVar23 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar50;
LAB_0028877e:
            bVar17 = (fVar96 <= fVar44 && bVar19) && bVar17;
            valid.field_0.i[0] = -(uint)bVar17;
            bVar18 = (fVar97 <= fVar44 && bVar20) && bVar18;
            valid.field_0.i[1] = -(uint)bVar18;
            bVar15 = (fVar98 <= fVar44 && bVar16) && bVar15;
            valid.field_0.i[2] = -(uint)bVar15;
            bVar13 = (fVar99 <= fVar44 && bVar14) && bVar13;
            valid.field_0.i[3] = -(uint)bVar13;
            iVar21 = movmskps(uVar50,(undefined1  [16])valid.field_0);
            if (iVar21 == 0) {
              return;
            }
            hit.vt.field_0.v[0] = fVar96;
            hit.vt.field_0.v[1] = fVar97;
            hit.vt.field_0.v[2] = fVar98;
            hit.vt.field_0.v[3] = fVar99;
            hit.vNg.field_0._0_4_ = fVar5 * fVar46 - fVar105;
            hit.vNg.field_0._4_4_ = fVar5 * fVar48 - fVar106;
            hit.vNg.field_0._8_4_ = fVar5 * fVar68 - fVar107;
            hit.vNg.field_0._12_4_ = fVar5 * fVar78 - fVar108;
            hit.vNg.field_0._16_4_ = fVar6 * fVar46 - fVar101;
            hit.vNg.field_0._20_4_ = fVar6 * fVar48 - fVar102;
            hit.vNg.field_0._24_4_ = fVar6 * fVar68 - fVar103;
            hit.vNg.field_0._28_4_ = fVar6 * fVar78 - fVar104;
            hit.vNg.field_0._32_4_ = fVar7 * fVar46 - fVar109;
            hit.vNg.field_0._36_4_ = fVar7 * fVar48 - fVar110;
            hit.vNg.field_0._40_4_ = fVar7 * fVar68 - fVar111;
            hit.vNg.field_0._44_4_ = fVar7 * fVar78 - fVar112;
            pSVar9 = context->scene;
            auVar39._0_4_ = (uint)fVar96 & valid.field_0.i[0];
            auVar39._4_4_ = (uint)fVar97 & valid.field_0.i[1];
            auVar39._8_4_ = (uint)fVar98 & valid.field_0.i[2];
            auVar39._12_4_ = (uint)fVar99 & valid.field_0.i[3];
            auVar58._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar58._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar58._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar58 = auVar58 | auVar39;
            auVar73._4_4_ = auVar58._0_4_;
            auVar73._0_4_ = auVar58._4_4_;
            auVar73._8_4_ = auVar58._12_4_;
            auVar73._12_4_ = auVar58._8_4_;
            auVar92 = minps(auVar73,auVar58);
            auVar40._0_8_ = auVar92._8_8_;
            auVar40._8_4_ = auVar92._0_4_;
            auVar40._12_4_ = auVar92._4_4_;
            auVar92 = minps(auVar40,auVar92);
            auVar41._0_8_ =
                 CONCAT44(-(uint)(auVar92._4_4_ == auVar58._4_4_ && bVar18),
                          -(uint)(auVar92._0_4_ == auVar58._0_4_ && bVar17));
            auVar41._8_4_ = -(uint)(auVar92._8_4_ == auVar58._8_4_ && bVar15);
            auVar41._12_4_ = -(uint)(auVar92._12_4_ == auVar58._12_4_ && bVar13);
            iVar21 = movmskps(iVar21,auVar41);
            aVar86 = valid.field_0;
            if (iVar21 != 0) {
              aVar86.i[2] = auVar41._8_4_;
              aVar86._0_8_ = auVar41._0_8_;
              aVar86.i[3] = auVar41._12_4_;
            }
            uVar22 = movmskps(iVar21,(undefined1  [16])aVar86);
            lVar27 = 0;
            if (CONCAT44(uVar23,uVar22) != 0) {
              for (; (CONCAT44(uVar23,uVar22) >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            do {
              args.hit = (RTCHitN *)&h;
              args.valid = (int *)local_238;
              h.geomID.field_0.i[0] = local_d8[lVar27];
              uVar24 = (ulong)h.geomID.field_0.i[0];
              pGVar10 = (pSVar9->geometries).items[uVar24].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_238 + lVar27 * 4 + -0x10) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar27];
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x10);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x20);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar27];
                  *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar27 * 4);
                h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4);
                h.Ng.field_0._16_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x10);
                uVar23 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x20);
                h.Ng.field_0._36_4_ = uVar23;
                h.Ng.field_0._32_4_ = uVar23;
                h.Ng.field_0._40_4_ = uVar23;
                h.Ng.field_0._44_4_ = uVar23;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
                h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
                h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
                h.v.field_0._0_8_ = 0;
                h.v.field_0._8_8_ = 0;
                h.u.field_0._0_8_ = 0;
                h.u.field_0._8_8_ = 0;
                h.primID.field_0.i[1] = h.primID.field_0.i[0];
                h.primID.field_0.i[2] = h.primID.field_0.i[0];
                h.primID.field_0.i[3] = h.primID.field_0.i[0];
                h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
                h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
                h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
                h.instID[0].field_0.i[0] = context->user->instID[0];
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar27];
                local_238 = *pauVar28;
                args.geometryUserPtr = pGVar10->userPtr;
                args.context = context->user;
                args.N = 4;
                p_Var25 = pGVar10->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var25 != (RTCFilterFunctionN)0x0) {
                  local_220 = pauVar28;
                  p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
                  pauVar28 = local_220;
                }
                auVar59._0_4_ = -(uint)(local_238._0_4_ == 0);
                auVar59._4_4_ = -(uint)(local_238._4_4_ == 0);
                auVar59._8_4_ = -(uint)(local_238._8_4_ == 0);
                auVar59._12_4_ = -(uint)(local_238._12_4_ == 0);
                uVar50 = movmskps((int)p_Var25,auVar59);
                pRVar26 = (RTCRayN *)(ulong)(uVar50 ^ 0xf);
                if ((uVar50 ^ 0xf) == 0) {
                  auVar12._8_4_ = 0xffffffff;
                  auVar12._0_8_ = 0xffffffffffffffff;
                  auVar12._12_4_ = 0xffffffff;
                  auVar60 = auVar59 ^ auVar12;
                }
                else {
                  p_Var25 = context->args->filter;
                  if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
                  }
                  auVar42._0_4_ = -(uint)(local_238._0_4_ == 0);
                  auVar42._4_4_ = -(uint)(local_238._4_4_ == 0);
                  auVar42._8_4_ = -(uint)(local_238._8_4_ == 0);
                  auVar42._12_4_ = -(uint)(local_238._12_4_ == 0);
                  auVar60._8_4_ = 0xffffffff;
                  auVar60._0_8_ = 0xffffffffffffffff;
                  auVar60._12_4_ = 0xffffffff;
                  auVar60 = auVar42 ^ auVar60;
                  uVar50 = movmskps((int)p_Var25,auVar42);
                  pRVar26 = (RTCRayN *)(ulong)(uVar50 ^ 0xf);
                  if ((uVar50 ^ 0xf) != 0) {
                    auVar74._0_4_ = *(uint *)(args.ray + 0xc0) & auVar42._0_4_;
                    auVar74._4_4_ = *(uint *)(args.ray + 0xc4) & auVar42._4_4_;
                    auVar74._8_4_ = *(uint *)(args.ray + 200) & auVar42._8_4_;
                    auVar74._12_4_ = *(uint *)(args.ray + 0xcc) & auVar42._12_4_;
                    auVar95._0_4_ = ~auVar42._0_4_ & *(uint *)args.hit;
                    auVar95._4_4_ = ~auVar42._4_4_ & *(uint *)(args.hit + 4);
                    auVar95._8_4_ = ~auVar42._8_4_ & *(uint *)(args.hit + 8);
                    auVar95._12_4_ = ~auVar42._12_4_ & *(uint *)(args.hit + 0xc);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar95 | auVar74;
                    uVar50 = *(uint *)(args.hit + 0x14);
                    uVar65 = *(uint *)(args.hit + 0x18);
                    uVar66 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar42._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar42._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar42._4_4_ & uVar50 | *(uint *)(args.ray + 0xd4) & auVar42._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar42._8_4_ & uVar65 | *(uint *)(args.ray + 0xd8) & auVar42._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar42._12_4_ & uVar66 | *(uint *)(args.ray + 0xdc) & auVar42._12_4_;
                    auVar87._0_4_ = *(uint *)(args.ray + 0xe0) & auVar42._0_4_;
                    auVar87._4_4_ = *(uint *)(args.ray + 0xe4) & auVar42._4_4_;
                    auVar87._8_4_ = *(uint *)(args.ray + 0xe8) & auVar42._8_4_;
                    auVar87._12_4_ = *(uint *)(args.ray + 0xec) & auVar42._12_4_;
                    auVar75._0_4_ = ~auVar42._0_4_ & *(uint *)(args.hit + 0x20);
                    auVar75._4_4_ = ~auVar42._4_4_ & *(uint *)(args.hit + 0x24);
                    auVar75._8_4_ = ~auVar42._8_4_ & *(uint *)(args.hit + 0x28);
                    auVar75._12_4_ = ~auVar42._12_4_ & *(uint *)(args.hit + 0x2c);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar75 | auVar87;
                    auVar93._0_4_ = *(uint *)(args.ray + 0xf0) & auVar42._0_4_;
                    auVar93._4_4_ = *(uint *)(args.ray + 0xf4) & auVar42._4_4_;
                    auVar93._8_4_ = *(uint *)(args.ray + 0xf8) & auVar42._8_4_;
                    auVar93._12_4_ = *(uint *)(args.ray + 0xfc) & auVar42._12_4_;
                    auVar76._0_4_ = ~auVar42._0_4_ & *(uint *)(args.hit + 0x30);
                    auVar76._4_4_ = ~auVar42._4_4_ & *(uint *)(args.hit + 0x34);
                    auVar76._8_4_ = ~auVar42._8_4_ & *(uint *)(args.hit + 0x38);
                    auVar76._12_4_ = ~auVar42._12_4_ & *(uint *)(args.hit + 0x3c);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar76 | auVar93;
                    uVar50 = *(uint *)(args.hit + 0x44);
                    uVar65 = *(uint *)(args.hit + 0x48);
                    uVar66 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar42._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar42._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar42._4_4_ & uVar50 | *(uint *)(args.ray + 0x104) & auVar42._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar42._8_4_ & uVar65 | *(uint *)(args.ray + 0x108) & auVar42._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar42._12_4_ & uVar66 | *(uint *)(args.ray + 0x10c) & auVar42._12_4_;
                    uVar50 = *(uint *)(args.hit + 0x54);
                    uVar65 = *(uint *)(args.hit + 0x58);
                    uVar66 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar42._0_4_ |
                         ~auVar42._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar42._4_4_ | ~auVar42._4_4_ & uVar50;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar42._8_4_ | ~auVar42._8_4_ & uVar65;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar42._12_4_ | ~auVar42._12_4_ & uVar66;
                    uVar50 = *(uint *)(args.hit + 100);
                    uVar65 = *(uint *)(args.hit + 0x68);
                    uVar66 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar42._0_4_ |
                         ~auVar42._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar42._4_4_ | ~auVar42._4_4_ & uVar50;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar42._8_4_ | ~auVar42._8_4_ & uVar65;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar42._12_4_ | ~auVar42._12_4_ & uVar66;
                    uVar50 = *(uint *)(args.hit + 0x74);
                    uVar65 = *(uint *)(args.hit + 0x78);
                    uVar66 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar42._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar42._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar42._4_4_ & uVar50 | *(uint *)(args.ray + 0x134) & auVar42._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar42._8_4_ & uVar65 | *(uint *)(args.ray + 0x138) & auVar42._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar42._12_4_ & uVar66 | *(uint *)(args.ray + 0x13c) & auVar42._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar42 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar42;
                    pRVar26 = args.ray;
                  }
                }
                auVar64._0_4_ = auVar60._0_4_ << 0x1f;
                auVar64._4_4_ = auVar60._4_4_ << 0x1f;
                auVar64._8_4_ = auVar60._8_4_ << 0x1f;
                auVar64._12_4_ = auVar60._12_4_ << 0x1f;
                iVar21 = movmskps((int)pRVar26,auVar64);
                uVar24 = CONCAT44((int)((ulong)pRVar26 >> 0x20),iVar21);
                if (iVar21 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar44;
                }
                else {
                  fVar44 = *(float *)(ray + k * 4 + 0x80);
                }
                *(undefined4 *)(local_238 + lVar27 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar96 <= fVar44) & valid.field_0.i[0];
                valid.field_0.i[1] = -(uint)(fVar97 <= fVar44) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(fVar98 <= fVar44) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar99 <= fVar44) & valid.field_0.i[3];
              }
              iVar21 = movmskps((int)uVar24,(undefined1  [16])valid.field_0);
              if (iVar21 == 0) {
                return;
              }
              uVar50 = valid.field_0._0_4_;
              uVar65 = valid.field_0._4_4_;
              uVar66 = valid.field_0._8_4_;
              uVar67 = valid.field_0._12_4_;
              auVar61._0_4_ = uVar50 & (uint)fVar96;
              auVar61._4_4_ = uVar65 & (uint)fVar97;
              auVar61._8_4_ = uVar66 & (uint)fVar98;
              auVar61._12_4_ = uVar67 & (uint)fVar99;
              auVar77._0_8_ = CONCAT44(~uVar65,~uVar50) & 0x7f8000007f800000;
              auVar77._8_4_ = ~uVar66 & 0x7f800000;
              auVar77._12_4_ = ~uVar67 & 0x7f800000;
              auVar77 = auVar77 | auVar61;
              auVar83._4_4_ = auVar77._0_4_;
              auVar83._0_4_ = auVar77._4_4_;
              auVar83._8_4_ = auVar77._12_4_;
              auVar83._12_4_ = auVar77._8_4_;
              auVar92 = minps(auVar83,auVar77);
              auVar62._0_8_ = auVar92._8_8_;
              auVar62._8_4_ = auVar92._0_4_;
              auVar62._12_4_ = auVar92._4_4_;
              auVar92 = minps(auVar62,auVar92);
              auVar63._0_8_ =
                   CONCAT44(-(uint)(auVar92._4_4_ == auVar77._4_4_) & uVar65,
                            -(uint)(auVar92._0_4_ == auVar77._0_4_) & uVar50);
              auVar63._8_4_ = -(uint)(auVar92._8_4_ == auVar77._8_4_) & uVar66;
              auVar63._12_4_ = -(uint)(auVar92._12_4_ == auVar77._12_4_) & uVar67;
              iVar21 = movmskps(iVar21,auVar63);
              aVar43 = valid.field_0;
              if (iVar21 != 0) {
                aVar43.i[2] = auVar63._8_4_;
                aVar43._0_8_ = auVar63._0_8_;
                aVar43.i[3] = auVar63._12_4_;
              }
              uVar23 = movmskps(iVar21,(undefined1  [16])aVar43);
              uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar23);
              lVar27 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
            } while( true );
          }
          h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar27 * 4);
          h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4);
          h.Ng.field_0._16_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x10);
          h.Ng.field_0._36_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar27 * 4 + 0x20);
          h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._32_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._40_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._44_4_ = h.Ng.field_0._36_4_;
          h.v.field_0._0_8_ = 0;
          h.v.field_0._8_8_ = 0;
          h.u.field_0._0_8_ = 0;
          h.u.field_0._8_8_ = 0;
          h.primID.field_0.i[1] = h.primID.field_0.i[0];
          h.primID.field_0.i[2] = h.primID.field_0.i[0];
          h.primID.field_0.i[3] = h.primID.field_0.i[0];
          h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
          h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
          h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
          h.instID[0].field_0.i[0] = context->user->instID[0];
          h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
          h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
          h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
          h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar27];
          local_238 = *pauVar28;
          args.geometryUserPtr = pGVar10->userPtr;
          args.context = context->user;
          args.N = 4;
          p_Var25 = pGVar10->intersectionFilterN;
          if (p_Var25 != (RTCFilterFunctionN)0x0) {
            local_220 = pauVar28;
            p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
            pauVar28 = local_220;
          }
          auVar53._0_4_ = -(uint)(local_238._0_4_ == 0);
          auVar53._4_4_ = -(uint)(local_238._4_4_ == 0);
          auVar53._8_4_ = -(uint)(local_238._8_4_ == 0);
          auVar53._12_4_ = -(uint)(local_238._12_4_ == 0);
          uVar50 = movmskps((int)p_Var25,auVar53);
          pRVar26 = (RTCRayN *)(ulong)(uVar50 ^ 0xf);
          if ((uVar50 ^ 0xf) == 0) {
            auVar53 = auVar53 ^ _DAT_01f46b70;
          }
          else {
            p_Var25 = context->args->filter;
            if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
            }
            auVar37._0_4_ = -(uint)(local_238._0_4_ == 0);
            auVar37._4_4_ = -(uint)(local_238._4_4_ == 0);
            auVar37._8_4_ = -(uint)(local_238._8_4_ == 0);
            auVar37._12_4_ = -(uint)(local_238._12_4_ == 0);
            auVar53 = auVar37 ^ _DAT_01f46b70;
            uVar50 = movmskps((int)p_Var25,auVar37);
            pRVar26 = (RTCRayN *)(ulong)(uVar50 ^ 0xf);
            if ((uVar50 ^ 0xf) != 0) {
              uVar50 = *(uint *)(args.hit + 4);
              uVar65 = *(uint *)(args.hit + 8);
              uVar66 = *(uint *)(args.hit + 0xc);
              *(uint *)(args.ray + 0xc0) =
                   ~auVar37._0_4_ & *(uint *)args.hit | *(uint *)(args.ray + 0xc0) & auVar37._0_4_;
              *(uint *)(args.ray + 0xc4) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0xc4) & auVar37._4_4_;
              *(uint *)(args.ray + 200) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 200) & auVar37._8_4_;
              *(uint *)(args.ray + 0xcc) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0xcc) & auVar37._12_4_;
              uVar50 = *(uint *)(args.hit + 0x14);
              uVar65 = *(uint *)(args.hit + 0x18);
              uVar66 = *(uint *)(args.hit + 0x1c);
              *(uint *)(args.ray + 0xd0) =
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x10) |
                   *(uint *)(args.ray + 0xd0) & auVar37._0_4_;
              *(uint *)(args.ray + 0xd4) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0xd4) & auVar37._4_4_;
              *(uint *)(args.ray + 0xd8) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 0xd8) & auVar37._8_4_;
              *(uint *)(args.ray + 0xdc) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0xdc) & auVar37._12_4_;
              uVar50 = *(uint *)(args.hit + 0x24);
              uVar65 = *(uint *)(args.hit + 0x28);
              uVar66 = *(uint *)(args.hit + 0x2c);
              *(uint *)(args.ray + 0xe0) =
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x20) |
                   *(uint *)(args.ray + 0xe0) & auVar37._0_4_;
              *(uint *)(args.ray + 0xe4) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0xe4) & auVar37._4_4_;
              *(uint *)(args.ray + 0xe8) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 0xe8) & auVar37._8_4_;
              *(uint *)(args.ray + 0xec) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0xec) & auVar37._12_4_;
              uVar50 = *(uint *)(args.hit + 0x34);
              uVar65 = *(uint *)(args.hit + 0x38);
              uVar66 = *(uint *)(args.hit + 0x3c);
              *(uint *)(args.ray + 0xf0) =
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x30) |
                   *(uint *)(args.ray + 0xf0) & auVar37._0_4_;
              *(uint *)(args.ray + 0xf4) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0xf4) & auVar37._4_4_;
              *(uint *)(args.ray + 0xf8) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 0xf8) & auVar37._8_4_;
              *(uint *)(args.ray + 0xfc) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0xfc) & auVar37._12_4_;
              uVar50 = *(uint *)(args.hit + 0x44);
              uVar65 = *(uint *)(args.hit + 0x48);
              uVar66 = *(uint *)(args.hit + 0x4c);
              *(uint *)(args.ray + 0x100) =
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x40) |
                   *(uint *)(args.ray + 0x100) & auVar37._0_4_;
              *(uint *)(args.ray + 0x104) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0x104) & auVar37._4_4_;
              *(uint *)(args.ray + 0x108) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 0x108) & auVar37._8_4_;
              *(uint *)(args.ray + 0x10c) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0x10c) & auVar37._12_4_;
              uVar50 = *(uint *)(args.hit + 0x54);
              uVar65 = *(uint *)(args.hit + 0x58);
              uVar66 = *(uint *)(args.hit + 0x5c);
              *(uint *)(args.ray + 0x110) =
                   *(uint *)(args.ray + 0x110) & auVar37._0_4_ |
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x50);
              *(uint *)(args.ray + 0x114) =
                   *(uint *)(args.ray + 0x114) & auVar37._4_4_ | ~auVar37._4_4_ & uVar50;
              *(uint *)(args.ray + 0x118) =
                   *(uint *)(args.ray + 0x118) & auVar37._8_4_ | ~auVar37._8_4_ & uVar65;
              *(uint *)(args.ray + 0x11c) =
                   *(uint *)(args.ray + 0x11c) & auVar37._12_4_ | ~auVar37._12_4_ & uVar66;
              uVar50 = *(uint *)(args.hit + 100);
              uVar65 = *(uint *)(args.hit + 0x68);
              uVar66 = *(uint *)(args.hit + 0x6c);
              *(uint *)(args.ray + 0x120) =
                   *(uint *)(args.ray + 0x120) & auVar37._0_4_ |
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x60);
              *(uint *)(args.ray + 0x124) =
                   *(uint *)(args.ray + 0x124) & auVar37._4_4_ | ~auVar37._4_4_ & uVar50;
              *(uint *)(args.ray + 0x128) =
                   *(uint *)(args.ray + 0x128) & auVar37._8_4_ | ~auVar37._8_4_ & uVar65;
              *(uint *)(args.ray + 300) =
                   *(uint *)(args.ray + 300) & auVar37._12_4_ | ~auVar37._12_4_ & uVar66;
              uVar50 = *(uint *)(args.hit + 0x74);
              uVar65 = *(uint *)(args.hit + 0x78);
              uVar66 = *(uint *)(args.hit + 0x7c);
              *(uint *)(args.ray + 0x130) =
                   ~auVar37._0_4_ & *(uint *)(args.hit + 0x70) |
                   *(uint *)(args.ray + 0x130) & auVar37._0_4_;
              *(uint *)(args.ray + 0x134) =
                   ~auVar37._4_4_ & uVar50 | *(uint *)(args.ray + 0x134) & auVar37._4_4_;
              *(uint *)(args.ray + 0x138) =
                   ~auVar37._8_4_ & uVar65 | *(uint *)(args.ray + 0x138) & auVar37._8_4_;
              *(uint *)(args.ray + 0x13c) =
                   ~auVar37._12_4_ & uVar66 | *(uint *)(args.ray + 0x13c) & auVar37._12_4_;
              *(undefined1 (*) [16])(args.ray + 0x140) =
                   ~auVar37 & *(undefined1 (*) [16])(args.hit + 0x80) |
                   *(undefined1 (*) [16])(args.ray + 0x140) & auVar37;
              pRVar26 = args.ray;
            }
          }
          auVar57._0_4_ = auVar53._0_4_ << 0x1f;
          auVar57._4_4_ = auVar53._4_4_ << 0x1f;
          auVar57._8_4_ = auVar53._8_4_ << 0x1f;
          auVar57._12_4_ = auVar53._12_4_ << 0x1f;
          iVar21 = movmskps((int)pRVar26,auVar57);
          uVar24 = CONCAT44((int)((ulong)pRVar26 >> 0x20),iVar21);
          if (iVar21 == 0) {
            *(float *)(ray + k * 4 + 0x80) = fVar44;
          }
          else {
            fVar44 = *(float *)(ray + k * 4 + 0x80);
          }
          *(undefined4 *)(local_238 + lVar27 * 4 + -0x10) = 0;
          valid.field_0.i[0] = -(uint)(fVar89 <= fVar44) & valid.field_0.i[0];
          valid.field_0.i[1] = -(uint)(fVar90 <= fVar44) & valid.field_0.i[1];
          valid.field_0.i[2] = -(uint)(fVar100 <= fVar44) & valid.field_0.i[2];
          valid.field_0.i[3] = -(uint)(fVar88 <= fVar44) & valid.field_0.i[3];
        }
        uVar23 = (undefined4)(uVar24 >> 0x20);
        uVar50 = movmskps((int)uVar24,(undefined1  [16])valid.field_0);
        if (uVar50 == 0) goto LAB_0028877e;
        uVar65 = valid.field_0._0_4_;
        uVar66 = valid.field_0._4_4_;
        uVar67 = valid.field_0._8_4_;
        uVar29 = valid.field_0._12_4_;
        auVar54._0_4_ = uVar65 & (uint)fVar89;
        auVar54._4_4_ = uVar66 & (uint)fVar90;
        auVar54._8_4_ = uVar67 & (uint)fVar100;
        auVar54._12_4_ = uVar29 & (uint)fVar88;
        auVar72._0_8_ = CONCAT44(~uVar66,~uVar65) & 0x7f8000007f800000;
        auVar72._8_4_ = ~uVar67 & 0x7f800000;
        auVar72._12_4_ = ~uVar29 & 0x7f800000;
        auVar72 = auVar72 | auVar54;
        auVar82._4_4_ = auVar72._0_4_;
        auVar82._0_4_ = auVar72._4_4_;
        auVar82._8_4_ = auVar72._12_4_;
        auVar82._12_4_ = auVar72._8_4_;
        auVar92 = minps(auVar82,auVar72);
        auVar55._0_8_ = auVar92._8_8_;
        auVar55._8_4_ = auVar92._0_4_;
        auVar55._12_4_ = auVar92._4_4_;
        auVar92 = minps(auVar55,auVar92);
        auVar56._0_8_ =
             CONCAT44(-(uint)(auVar92._4_4_ == auVar72._4_4_) & uVar66,
                      -(uint)(auVar92._0_4_ == auVar72._0_4_) & uVar65);
        auVar56._8_4_ = -(uint)(auVar92._8_4_ == auVar72._8_4_) & uVar67;
        auVar56._12_4_ = -(uint)(auVar92._12_4_ == auVar72._12_4_) & uVar29;
        iVar21 = movmskps(uVar50,auVar56);
        aVar38 = valid.field_0;
        if (iVar21 != 0) {
          aVar38.i[2] = auVar56._8_4_;
          aVar38._0_8_ = auVar56._0_8_;
          aVar38.i[3] = auVar56._12_4_;
        }
        uVar22 = movmskps(iVar21,(undefined1  [16])aVar38);
        lVar27 = 0;
        if (CONCAT44(uVar23,uVar22) != 0) {
          for (; (CONCAT44(uVar23,uVar22) >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }